

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hxx
# Opt level: O0

size_t __thiscall
andres::graph::
ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
build<lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>
           *this,Graph *graph,
          SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *mask)

{
  bool bVar1;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *pGVar2;
  size_t i;
  Index IVar3;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_RDX;
  Partition<unsigned_long> *in_RSI;
  Partition<unsigned_long> *in_RDI;
  size_t v1;
  size_t v0;
  size_t edge;
  size_t in_stack_ffffffffffffffb8;
  Partition<unsigned_long> *in_stack_ffffffffffffffd0;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this_00;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *element2;
  
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
            ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x14fed7);
  Partition<unsigned_long>::assign(in_stack_ffffffffffffffd0,(Index)in_RDI);
  this_00 = (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x0;
  while (element2 = this_00,
        pGVar2 = (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                 Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfEdges
                           ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x14ff01),
        this_00 < pGVar2) {
    bVar1 = lineage::ProblemGraph::
            SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::edge((SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_ffffffffffffffd0,(size_t)in_RDI);
    if (bVar1) {
      i = Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                    (this_00,in_stack_ffffffffffffffb8,0x14ff3a);
      in_stack_ffffffffffffffd0 =
           (Partition<unsigned_long> *)
           Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                     (this_00,in_stack_ffffffffffffffb8,0x14ff53);
      bVar1 = lineage::ProblemGraph::
              SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::vertex(in_RDX,i);
      if ((bVar1) &&
         (bVar1 = lineage::ProblemGraph::
                  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::vertex(in_RDX,(size_t)in_stack_ffffffffffffffd0), bVar1)) {
        Partition<unsigned_long>::merge(in_RSI,(Index)in_RDX,(Index)element2);
      }
    }
    this_00 = (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
              ((long)&(element2->vertices_).
                      super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  IVar3 = Partition<unsigned_long>::numberOfSets(in_RDI);
  return IVar3;
}

Assistant:

inline std::size_t
ComponentsByPartition<GRAPH>::build(
    const Graph& graph,
    const SUBGRAPH_MASK& mask
) {
    partition_.assign(graph.numberOfVertices());
    for(std::size_t edge = 0; edge < graph.numberOfEdges(); ++edge) {
        if(mask.edge(edge)) {
            const std::size_t v0 = graph.vertexOfEdge(edge, 0);
            const std::size_t v1 = graph.vertexOfEdge(edge, 1);
            if(mask.vertex(v0) && mask.vertex(v1)) {
                partition_.merge(v0, v1);
            }
        }
    }
    return partition_.numberOfSets();
}